

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BeginTooltip(void)

{
  float fVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *g;
  ImVec2 IVar4;
  char window_name [16];
  char acStack_18 [16];
  
  pIVar3 = GImGui;
  if (GImGui->DragDropWithinSourceOrTarget == true) {
    fVar1 = (GImGui->Style).MouseCursorScale;
    IVar2 = (GImGui->IO).MousePos;
    IVar4.x = IVar2.x + fVar1 * 16.0;
    IVar4.y = IVar2.y + fVar1 * 8.0;
    (GImGui->NextWindowData).PosVal = IVar4;
    (pIVar3->NextWindowData).PosPivotVal.x = 0.0;
    (pIVar3->NextWindowData).PosPivotVal.y = 0.0;
    (pIVar3->NextWindowData).PosCond = 1;
    (pIVar3->NextWindowData).BgAlphaVal = (pIVar3->Style).Colors[4].w * 0.6;
    (pIVar3->NextWindowData).BgAlphaCond = 1;
    BeginTooltipEx(0,true);
    return;
  }
  ImFormatString(acStack_18,0x10,"##Tooltip_%02d",(ulong)(uint)GImGui->TooltipOverrideCount);
  Begin(acStack_18,(bool *)0x0,0x20c0347);
  return;
}

Assistant:

void ImGui::BeginTooltip()
{
    ImGuiContext& g = *GImGui;
    if (g.DragDropWithinSourceOrTarget)
    {
        // The default tooltip position is a little offset to give space to see the context menu (it's also clamped within the current viewport/monitor)
        // In the context of a dragging tooltip we try to reduce that offset and we enforce following the cursor.
        // Whatever we do we want to call SetNextWindowPos() to enforce a tooltip position and disable clipping the tooltip without our display area, like regular tooltip do.
        //ImVec2 tooltip_pos = g.IO.MousePos - g.ActiveIdClickOffset - g.Style.WindowPadding;
        ImVec2 tooltip_pos = g.IO.MousePos + ImVec2(16 * g.Style.MouseCursorScale, 8 * g.Style.MouseCursorScale);
        SetNextWindowPos(tooltip_pos);
        SetNextWindowBgAlpha(g.Style.Colors[ImGuiCol_PopupBg].w * 0.60f);
        //PushStyleVar(ImGuiStyleVar_Alpha, g.Style.Alpha * 0.60f); // This would be nice but e.g ColorButton with checkboard has issue with transparent colors :(
        BeginTooltipEx(0, true);
    }
    else
    {
        BeginTooltipEx(0, false);
    }
}